

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hidpi.c
# Opt level: O2

void pretty_square(uint *p,int dimen)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  uint *puVar6;
  long lVar7;
  bool bVar8;
  
  memset(p,0x7f,(ulong)(uint)(dimen * dimen * 4));
  iVar2 = dimen / 4;
  iVar1 = (int)((long)dimen / 2);
  uVar5 = (ulong)iVar2;
  puVar6 = (uint *)(((long)dimen * 4 + 4) * uVar5 + (long)p);
  for (; (long)uVar5 < (long)(iVar1 + iVar2); uVar5 = uVar5 + 1) {
    puVar4 = puVar6;
    lVar7 = (long)iVar1;
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      uVar3 = 0;
      if ((uVar5 & 1) != 0) {
        uVar3 = (uint)((ulong)(uint)(((int)uVar5 - iVar2) * 0xff) / ((long)dimen / 2 & 0xffffffffU))
                | 0xdf0000;
      }
      *puVar4 = uVar3;
      puVar4 = puVar4 + dimen;
    }
    puVar6 = puVar6 + 1;
  }
  return;
}

Assistant:

void
pretty_square(unsigned int *p, int dimen)
{
  memset(p, 127, dimen*dimen*4);
  const int one_half_dimen = dimen / 2;
  const int one_quarter_dimen = one_half_dimen / 2;
  const int three_quarter_dimen = one_half_dimen + one_quarter_dimen;
  for (int x = one_quarter_dimen; x < three_quarter_dimen; x++)
    for (int y = one_quarter_dimen; y < three_quarter_dimen; y++)
      p[y*dimen + x] = (x & 1) ? MFB_RGB(223,0,(255*(x-one_quarter_dimen))/one_half_dimen) : MFB_RGB(0,0,0);
}